

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

bool icu_63::number::impl::GeneratorHelpers::integerWidth
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  UnicodeString *pUVar1;
  UErrorCode *this;
  bool bVar2;
  IntegerWidth IVar3;
  bool local_5d;
  ConstChar16Ptr local_50;
  anon_union_8_2_136a0349_for_fUnion local_48;
  undefined1 local_40;
  anon_union_8_2_136a0349_for_fUnion local_34;
  undefined1 local_2c;
  UErrorCode *local_28;
  UErrorCode *status_local;
  UnicodeString *sb_local;
  MacroProps *macros_local;
  
  local_5d = true;
  local_28 = status;
  status_local = (UErrorCode *)sb;
  sb_local = (UnicodeString *)macros;
  if (((macros->integerWidth).fHasError & 1U) == 0) {
    bVar2 = IntegerWidth::isBogus(&macros->integerWidth);
    local_5d = true;
    if (!bVar2) {
      pUVar1 = sb_local + 1;
      IVar3 = IntegerWidth::standard();
      local_48 = IVar3.fUnion;
      local_40 = IVar3.fHasError;
      local_34 = local_48;
      local_2c = local_40;
      local_5d = IntegerWidth::operator==
                           ((IntegerWidth *)((long)&pUVar1->fUnion + 0x34),
                            (IntegerWidth *)&local_34.minMaxInt);
    }
  }
  this = status_local;
  if (local_5d == false) {
    ConstChar16Ptr::ConstChar16Ptr(&local_50,L"integer-width/");
    icu_63::UnicodeString::append((UnicodeString *)this,&local_50,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_50);
    blueprint_helpers::generateIntegerWidthOption
              ((int)sb_local[1].fUnion.fStackFields.fBuffer[0x19],
               (int)sb_local[1].fUnion.fStackFields.fBuffer[0x1a],(UnicodeString *)status_local,
               local_28);
  }
  return local_5d == false;
}

Assistant:

bool GeneratorHelpers::integerWidth(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (macros.integerWidth.fHasError || macros.integerWidth.isBogus() ||
        macros.integerWidth == IntegerWidth::standard()) {
        // Error or Default
        return false;
    }
    sb.append(u"integer-width/", -1);
    blueprint_helpers::generateIntegerWidthOption(
            macros.integerWidth.fUnion.minMaxInt.fMinInt,
            macros.integerWidth.fUnion.minMaxInt.fMaxInt,
            sb,
            status);
    return true;
}